

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O2

ssize_t __thiscall Arcflow::write(Arcflow *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  FILE *__stream;
  undefined4 extraout_var;
  runtime_error *this_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  char _error_msg_ [256];
  
  if (this->ready == false) {
    snprintf(_error_msg_,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ready == true",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x261);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,_error_msg_);
  }
  else {
    __stream = fopen((char *)CONCAT44(in_register_00000034,__fd),"w");
    if (__stream != (FILE *)0x0) {
      write(this,(int)__stream,__buf_00,__n);
      iVar1 = fclose(__stream);
      return CONCAT44(extraout_var,iVar1);
    }
    perror("fopen");
    snprintf(_error_msg_,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "fout != NULL",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x266);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,_error_msg_);
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Arcflow::write(const char *fname) {
	throw_assert(ready == true);
	FILE *fout = fopen(fname, "w");
	if (fout == NULL) {
		perror("fopen");
	}
	throw_assert(fout != NULL);
	write(fout);
	fclose(fout);
}